

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

int FreeEXRImage(EXRImage *exr_image)

{
  uchar **ppuVar1;
  int i_1;
  long lVar2;
  int i;
  int iVar3;
  long lVar4;
  int tid;
  
  if (exr_image == (EXRImage *)0x0) {
    iVar3 = -3;
  }
  else {
    for (lVar4 = 0; ppuVar1 = exr_image->images, lVar4 < exr_image->num_channels; lVar4 = lVar4 + 1)
    {
      if (ppuVar1 != (uchar **)0x0) {
        free(ppuVar1[lVar4]);
      }
    }
    free(ppuVar1);
    if (exr_image->tiles == (EXRTile *)0x0) {
      iVar3 = 0;
    }
    else {
      iVar3 = 0;
      for (lVar4 = 0; lVar4 < exr_image->num_tiles; lVar4 = lVar4 + 1) {
        for (lVar2 = 0; ppuVar1 = exr_image->tiles[lVar4].images, lVar2 < exr_image->num_channels;
            lVar2 = lVar2 + 1) {
          if (ppuVar1 != (uchar **)0x0) {
            free(ppuVar1[lVar2]);
          }
        }
        free(ppuVar1);
      }
    }
  }
  return iVar3;
}

Assistant:

int FreeEXRImage(EXRImage *exr_image) {
  if (exr_image == NULL) {
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  for (int i = 0; i < exr_image->num_channels; i++) {
    if (exr_image->images && exr_image->images[i]) {
      free(exr_image->images[i]);
    }
  }

  if (exr_image->images) {
    free(exr_image->images);
  }

  if (exr_image->tiles) {
    for (int tid = 0; tid < exr_image->num_tiles; tid++) {
      for (int i = 0; i < exr_image->num_channels; i++) {
        if (exr_image->tiles[tid].images && exr_image->tiles[tid].images[i]) {
          free(exr_image->tiles[tid].images[i]);
        }
      }
      if (exr_image->tiles[tid].images) {
        free(exr_image->tiles[tid].images);
      }
    }
  }

  return TINYEXR_SUCCESS;
}